

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<Node>::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  
  for (lVar3 = 0; (ulong)num * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
    puVar1 = (undefined8 *)((long)pDst_void + lVar3);
    uVar2 = *(undefined8 *)((long)pSrc_void + 8);
    *puVar1 = *pSrc_void;
    puVar1[1] = uVar2;
    optimize_color_params::unpacked_endpoint::unpacked_endpoint
              ((unpacked_endpoint *)(puVar1 + 2),(unpacked_endpoint *)((long)pSrc_void + 0x10));
    pSrc_void = (void *)((long)pSrc_void + 0x18);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }